

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseephemeron(global_State *g,Table *h,int inv)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  GCObject *local_58;
  Node *local_48;
  Node *n;
  uint nsize;
  uint asize;
  uint i;
  int hasww;
  int hasclears;
  int marked;
  int inv_local;
  Table *h_local;
  global_State *g_local;
  
  hasww = 0;
  bVar2 = false;
  bVar1 = false;
  uVar3 = luaH_realasize(h);
  uVar4 = 1 << (h->lsizenode & 0x1f);
  for (nsize = 0; nsize < uVar3; nsize = nsize + 1) {
    if (((h->array[nsize].tt_ & 0x40) != 0) && (((h->array[nsize].value_.gc)->marked & 0x18) != 0))
    {
      hasww = 1;
      reallymarkobject(g,h->array[nsize].value_.gc);
    }
  }
  for (nsize = 0; nsize < uVar4; nsize = nsize + 1) {
    if (inv == 0) {
      local_48 = h->node + nsize;
    }
    else {
      local_48 = h->node + ((uVar4 - 1) - nsize);
    }
    if (((local_48->u).tt_ & 0xf) == 0) {
      clearkey(local_48);
    }
    else {
      if (((local_48->u).key_tt & 0x40) == 0) {
        local_58 = (GCObject *)0x0;
      }
      else {
        local_58 = (local_48->u).key_val.gc;
      }
      iVar5 = iscleared(g,local_58);
      if (iVar5 == 0) {
        if ((((local_48->u).tt_ & 0x40) != 0) && ((((local_48->u).value_.gc)->marked & 0x18) != 0))
        {
          hasww = 1;
          reallymarkobject(g,(local_48->u).value_.gc);
        }
      }
      else {
        bVar2 = true;
        if ((((local_48->u).tt_ & 0x40) != 0) && ((((local_48->u).value_.gc)->marked & 0x18) != 0))
        {
          bVar1 = true;
        }
      }
    }
  }
  if (g->gcstate == '\0') {
    linkgclist_((GCObject *)h,&h->gclist,&g->grayagain);
  }
  else if (bVar1) {
    linkgclist_((GCObject *)h,&h->gclist,&g->ephemeron);
  }
  else if (bVar2) {
    linkgclist_((GCObject *)h,&h->gclist,&g->allweak);
  }
  else {
    genlink(g,(GCObject *)h);
  }
  return hasww;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int asize = luaH_realasize(h);
  unsigned int nsize = sizenode(h);
  /* traverse array part */
  for (i = 0; i < asize; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}